

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>::clear
          (SmallVector<diligent_spirv_cross::Resource,_8UL> *this)

{
  Resource *pRVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  if ((this->super_VectorView<diligent_spirv_cross::Resource>).buffer_size != 0) {
    lVar4 = 0x20;
    uVar5 = 0;
    do {
      pRVar1 = (this->super_VectorView<diligent_spirv_cross::Resource>).ptr;
      plVar2 = *(long **)((long)pRVar1 + lVar4 + -0x10);
      plVar3 = (long *)((long)&(pRVar1->id).id + lVar4);
      if (plVar3 != plVar2) {
        operator_delete(plVar2,*plVar3 + 1);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 < (this->super_VectorView<diligent_spirv_cross::Resource>).buffer_size);
  }
  (this->super_VectorView<diligent_spirv_cross::Resource>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}